

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O2

void __thiscall PatternModel::transpose(PatternModel *this,int amount)

{
  uint8_t uVar1;
  uint8_t uVar2;
  TransposeCmd *this_00;
  TrackRow *pTVar3;
  NoteEditCmd *this_01;
  QUndoStack *pQVar4;
  QArrayDataPointer<char16_t> local_40;
  TrackRow rowcopy;
  
  if (amount != 0) {
    if (this->mHasSelection == true) {
      this_00 = (TransposeCmd *)operator_new(0x48);
      TransposeCmd::TransposeCmd(this_00,this,(int8_t)amount);
      tr((QString *)&local_40,"transpose selection",(char *)0x0,-1);
      QUndoCommand::setText((QString *)this_00);
    }
    else {
      pTVar3 = cursorTrackRow(this);
      rowcopy = *pTVar3;
      trackerboy::TrackRow::transpose(&rowcopy,amount);
      uVar2 = rowcopy.note;
      uVar1 = pTVar3->note;
      if (rowcopy.note == uVar1) {
        return;
      }
      this_01 = (NoteEditCmd *)operator_new(0x20);
      NoteEditCmd::TrackEditCmd(this_01,this,uVar2,uVar1,(QUndoCommand *)0x0);
      tr((QString *)&local_40,"transpose note",(char *)0x0,-1);
      QUndoCommand::setText((QString *)this_01);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    pQVar4 = Module::undoStack(this->mModule);
    QUndoStack::push((QUndoCommand *)pQVar4);
  }
  return;
}

Assistant:

void PatternModel::transpose(int amount) {

    if (amount) { // a transpose of 0 does nothing
        if (hasSelection()) {
            auto cmd = new TransposeCmd(*this, (int8_t)amount);
            cmd->setText(tr("transpose selection"));
            mModule.undoStack()->push(cmd);
        } else {
            auto &rowdata = cursorTrackRow();
            auto rowcopy = rowdata;
            rowcopy.transpose(amount);
            // if the transpose resulted in a change, create and push an edit command
            if (rowcopy.note != rowdata.note) {
                auto cmd = new NoteEditCmd(*this, rowcopy.note, rowdata.note);
                cmd->setText(tr("transpose note"));
                mModule.undoStack()->push(cmd);
            }

        }
    }
}